

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.h
# Opt level: O2

void __thiscall
google::protobuf::Map<long,double>::insert<google::protobuf::Map<long,double>::const_iterator>
          (Map<long,double> *this,const_iterator first,const_iterator last)

{
  double dVar1;
  value_type *key;
  double *pdVar2;
  iterator_base<const_google::protobuf::Map<long,_double>::KeyValuePair> local_58;
  iterator local_38;
  
  local_58.bucket_index_ = first.it_.bucket_index_;
  local_58.node_ = first.it_.node_;
  local_58.m_ = first.it_.m_;
  while (local_58.node_ != last.it_.node_) {
    Map<long,_double>::find(&local_38,(Map<long,_double> *)this,&(((local_58.node_)->kv).v_)->first)
    ;
    if (local_38.it_.node_ == (Node *)0x0) {
      key = ((local_58.node_)->kv).v_;
      dVar1 = key->second;
      pdVar2 = Map<long,_double>::operator[]((Map<long,_double> *)this,&key->first);
      *pdVar2 = dVar1;
    }
    Map<long,_double>::InnerMap::
    iterator_base<const_google::protobuf::Map<long,_double>::KeyValuePair>::operator++(&local_58);
  }
  return;
}

Assistant:

void insert(InputIt first, InputIt last) {
    for (InputIt it = first; it != last; ++it) {
      iterator exist_it = find(it->first);
      if (exist_it == end()) {
        operator[](it->first) = it->second;
      }
    }
  }